

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phyr_math.h
# Opt level: O2

void phyr::solveSurfaceNormal
               (Vector3f *dpdu,Vector3f *dpdv,Vector3f *d2pduu,Vector3f *d2pduv,Vector3f *d2pdvv,
               Normal3f *dndu,Normal3f *dndv)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  Vector3f n;
  Vector3<double> local_60;
  Vector3<double> local_48;
  
  dVar4 = dot<double>(dpdu,dpdu);
  dVar5 = dot<double>(dpdu,dpdv);
  dVar6 = dot<double>(dpdv,dpdv);
  cross<double>(dpdu,dpdv);
  normalize<double>(&local_48,&local_60);
  dVar9 = d2pduu->z * local_48.z + d2pduu->x * local_48.x + d2pduu->y * local_48.y;
  dVar7 = d2pduv->z * local_48.z + d2pduv->x * local_48.x + d2pduv->y * local_48.y;
  dVar8 = local_48.z * d2pdvv->z + local_48.x * d2pdvv->x + local_48.y * d2pdvv->y;
  dVar11 = 1.0 / (dVar4 * dVar6 - dVar5 * dVar5);
  dVar12 = (dVar7 * dVar5 - dVar6 * dVar9) * dVar11;
  dVar1 = dpdu->z;
  dVar10 = (dVar9 * dVar5 - dVar4 * dVar7) * dVar11;
  dVar9 = dpdv->z;
  dVar2 = dpdu->y;
  dVar3 = dpdv->y;
  dndu->x = dVar10 * dpdv->x + dVar12 * dpdu->x;
  dndu->y = dVar10 * dVar3 + dVar12 * dVar2;
  dndu->z = dVar9 * dVar10 + dVar1 * dVar12;
  dVar6 = (dVar7 * dVar8 - dVar6 * dVar7) * dVar11;
  dVar1 = dpdu->z;
  dVar11 = (dVar7 * dVar5 - dVar8 * dVar4) * dVar11;
  dVar9 = dpdv->z;
  dVar2 = dpdu->y;
  dVar3 = dpdv->y;
  dndv->x = dVar11 * dpdv->x + dVar6 * dpdu->x;
  dndv->y = dVar11 * dVar3 + dVar6 * dVar2;
  dndv->z = dVar9 * dVar11 + dVar1 * dVar6;
  return;
}

Assistant:

inline void solveSurfaceNormal(const Vector3f& dpdu, const Vector3f& dpdv,
                               const Vector3f& d2pduu, const Vector3f& d2pduv,
                               const Vector3f& d2pdvv, Normal3f* dndu, Normal3f* dndv) {
    // Compute coefficients for fundamental forms
    Real E = dot(dpdu, dpdu), F = dot(dpdu, dpdv), G = dot(dpdv, dpdv);
    Vector3f n = normalize(cross(dpdu, dpdv));
    Real e = dot(n, d2pduu), f = dot(n, d2pduv), g = dot(n, d2pdvv);

    // Compute dndu, dndv
    Real invFac = 1 / (E * G - F * F);
    *dndu = Normal3f((f * F - e * G) * invFac * dpdu +
                     (e * F - f * E) * invFac * dpdv);
    *dndv = Normal3f((g * f - f * G) * invFac * dpdu +
                     (f * F - g * E) * invFac * dpdv);
}